

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::TrackValueInfoChangeForKills
          (GlobOpt *this,BasicBlock *block,Value *value,ValueInfo *newValueInfo,bool compensated)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *valueInfo;
  ArrayValueInfo *pAVar4;
  StackSym *pSVar5;
  bool local_62;
  bool local_61;
  bool local_52;
  bool local_51;
  bool trackNewValueInfo;
  bool trackOldValueInfo;
  ValueInfo *oldValueInfo;
  bool compensated_local;
  ValueInfo *newValueInfo_local;
  Value *value_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  newValueInfo_local = (ValueInfo *)value;
  value_local = (Value *)block;
  block_local = (BasicBlock *)this;
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f4,"(block)","block");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (newValueInfo_local == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f5,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (newValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32f6,"(newValueInfo)","newValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  valueInfo = ::Value::GetValueInfo((Value *)newValueInfo_local);
  bVar2 = ValueType::IsAnyOptimizedArray(&valueInfo->super_ValueType);
  if (bVar2) {
    bVar2 = ValueType::IsArrayOrObjectWithArray(&valueInfo->super_ValueType);
    VerifyArrayValueInfoForTracking(this,valueInfo,bVar2,(BasicBlock *)value_local,compensated);
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray(&valueInfo->super_ValueType);
  local_51 = true;
  if (!bVar2) {
    bVar2 = ValueType::IsOptimizedVirtualTypedArray(&valueInfo->super_ValueType);
    local_51 = true;
    if (!bVar2) {
      bVar2 = ValueType::IsOptimizedTypedArray(&valueInfo->super_ValueType);
      local_52 = false;
      if (bVar2) {
        bVar2 = ValueInfo::IsArrayValueInfo(valueInfo);
        local_52 = false;
        if (bVar2) {
          pAVar4 = ValueInfo::AsArrayValueInfo(valueInfo);
          pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(pAVar4);
          local_52 = pSVar5 != (StackSym *)0x0;
        }
      }
      local_51 = local_52;
    }
  }
  bVar2 = JsUtil::
          BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(*(BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          **)(value_local + 0x14),(Value **)&newValueInfo_local);
  if (local_51 != bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3309,
                       "(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value))"
                       ,
                       "trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsAnyOptimizedArray(&newValueInfo->super_ValueType);
  if (bVar2) {
    bVar2 = ValueType::IsArrayOrObjectWithArray(&newValueInfo->super_ValueType);
    VerifyArrayValueInfoForTracking(this,newValueInfo,bVar2,(BasicBlock *)value_local,compensated);
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray(&newValueInfo->super_ValueType);
  local_61 = true;
  if (!bVar2) {
    bVar2 = ValueType::IsOptimizedVirtualTypedArray(&newValueInfo->super_ValueType);
    local_61 = true;
    if (!bVar2) {
      bVar2 = ValueType::IsOptimizedTypedArray(&newValueInfo->super_ValueType);
      local_62 = false;
      if (bVar2) {
        bVar2 = ValueInfo::IsArrayValueInfo(newValueInfo);
        local_62 = false;
        if (bVar2) {
          pAVar4 = ValueInfo::AsArrayValueInfo(newValueInfo);
          pSVar5 = ArrayValueInfo::HeadSegmentLengthSym(pAVar4);
          local_62 = pSVar5 != (StackSym *)0x0;
        }
      }
      local_61 = local_62;
    }
  }
  if (local_51 != local_61) {
    if (local_61 == false) {
      JsUtil::
      BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Remove(*(BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 **)(value_local + 0x14),(Value **)&newValueInfo_local);
    }
    else {
      JsUtil::
      BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add(*(BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              **)(value_local + 0x14),(Value **)&newValueInfo_local);
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackValueInfoChangeForKills(BasicBlock *const block, Value *const value, ValueInfo *const newValueInfo, const bool compensated) const
{
    Assert(block);
    Assert(value);
    Assert(newValueInfo);

    ValueInfo *const oldValueInfo = value->GetValueInfo();

#if DBG
    if(oldValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(oldValueInfo, oldValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackOldValueInfo =
        oldValueInfo->IsArrayOrObjectWithArray() ||
        oldValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            oldValueInfo->IsOptimizedTypedArray() &&
            oldValueInfo->IsArrayValueInfo() &&
            oldValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );
    Assert(trackOldValueInfo == block->globOptData.valuesToKillOnCalls->ContainsKey(value));

#if DBG
    if(newValueInfo->IsAnyOptimizedArray())
    {
        VerifyArrayValueInfoForTracking(newValueInfo, newValueInfo->IsArrayOrObjectWithArray(), block, compensated);
    }
#endif

    const bool trackNewValueInfo =
        newValueInfo->IsArrayOrObjectWithArray() ||
        newValueInfo->IsOptimizedVirtualTypedArray() ||
        (
            newValueInfo->IsOptimizedTypedArray() &&
            newValueInfo->IsArrayValueInfo() &&
            newValueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()
        );

    if(trackOldValueInfo == trackNewValueInfo)
    {
        return;
    }

    if(trackNewValueInfo)
    {
        block->globOptData.valuesToKillOnCalls->Add(value);
    }
    else
    {
        block->globOptData.valuesToKillOnCalls->Remove(value);
    }
}